

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_ASYM_SCHEME_Marshal(TPMU_ASYM_SCHEME *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_ASYM_SCHEME *source_local;
  
  switch(selector) {
  case 0x10:
    source_local._6_2_ = 0;
    break;
  default:
    source_local._6_2_ = 0;
    break;
  case 0x14:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)&source->rsaes,buffer,size);
    break;
  case 0x15:
    source_local._6_2_ = TPMS_EMPTY_Marshal(&source->rsaes,buffer,size);
    break;
  case 0x16:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)&source->rsaes,buffer,size);
    break;
  case 0x17:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)&source->rsaes,buffer,size);
    break;
  case 0x18:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)&source->rsaes,buffer,size);
    break;
  case 0x19:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)&source->rsaes,buffer,size);
    break;
  case 0x1a:
    source_local._6_2_ = TPMS_SCHEME_ECDAA_Marshal((TPMS_SCHEME_ECDAA *)&source->ecdh,buffer,size);
    break;
  case 0x1c:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)&source->rsaes,buffer,size);
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_ASYM_SCHEME_Marshal(TPMU_ASYM_SCHEME *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_ECDH
        case TPM_ALG_ECDH:
            return TPMS_KEY_SCHEME_ECDH_Marshal((TPMS_KEY_SCHEME_ECDH *)&(source->ecdh), buffer, size);
#endif // ALG_ECDH
#if         ALG_ECMQV
        case TPM_ALG_ECMQV:
            return TPMS_KEY_SCHEME_ECMQV_Marshal((TPMS_KEY_SCHEME_ECMQV *)&(source->ecmqv), buffer, size);
#endif // ALG_ECMQV
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
            return TPMS_SIG_SCHEME_ECDAA_Marshal((TPMS_SIG_SCHEME_ECDAA *)&(source->ecdaa), buffer, size);
#endif // ALG_ECDAA
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
            return TPMS_SIG_SCHEME_RSASSA_Marshal((TPMS_SIG_SCHEME_RSASSA *)&(source->rsassa), buffer, size);
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
            return TPMS_SIG_SCHEME_RSAPSS_Marshal((TPMS_SIG_SCHEME_RSAPSS *)&(source->rsapss), buffer, size);
#endif // ALG_RSAPSS
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
            return TPMS_SIG_SCHEME_ECDSA_Marshal((TPMS_SIG_SCHEME_ECDSA *)&(source->ecdsa), buffer, size);
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
            return TPMS_SIG_SCHEME_SM2_Marshal((TPMS_SIG_SCHEME_SM2 *)&(source->sm2), buffer, size);
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
            return TPMS_SIG_SCHEME_ECSCHNORR_Marshal((TPMS_SIG_SCHEME_ECSCHNORR *)&(source->ecschnorr), buffer, size);
#endif // ALG_ECSCHNORR
#if         ALG_RSAES
        case TPM_ALG_RSAES:
            return TPMS_ENC_SCHEME_RSAES_Marshal((TPMS_ENC_SCHEME_RSAES *)&(source->rsaes), buffer, size);
#endif // ALG_RSAES
#if         ALG_OAEP
        case TPM_ALG_OAEP:
            return TPMS_ENC_SCHEME_OAEP_Marshal((TPMS_ENC_SCHEME_OAEP *)&(source->oaep), buffer, size);
#endif // ALG_OAEP
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}